

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.hpp
# Opt level: O3

graph * lattice::graph::simple(graph *__return_storage_ptr__,size_t dim,size_t length)

{
  basis local_68;
  unitcell local_50;
  
  basis::simple(&local_68,dim);
  unitcell::simple(&local_50,dim);
  graph(__return_storage_ptr__,&local_68,&local_50,length,periodic);
  std::vector<lattice::unitcell::bond_t,_std::allocator<lattice::unitcell::bond_t>_>::~vector
            (&local_50.bonds_);
  std::vector<lattice::unitcell::site_t,_std::allocator<lattice::unitcell::site_t>_>::~vector
            (&local_50.sites_);
  free(local_68.basis_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
       m_data);
  return __return_storage_ptr__;
}

Assistant:

static graph simple(std::size_t dim, std::size_t length) {
    return graph(basis::simple(dim), unitcell::simple(dim), length);
  }